

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aceops_test.cc
# Opt level: O0

int test_report(void)

{
  code *pcVar1;
  char *__s;
  AceopsreportRequestType *pAVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1b1;
  int ret;
  HttpTestListener *local_190;
  HttpTestListener *listener;
  string local_180;
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [55];
  allocator<char> local_f9;
  string local_f8 [32];
  AceopsreportRequestType *local_d8;
  Aceops *aceops;
  undefined1 local_c8 [7];
  AceopsreportResponseType resp;
  AceopsreportRequestType req;
  
  aliyun::AceopsreportRequestType::AceopsreportRequestType((AceopsreportRequestType *)local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"cn-hangzhou",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"my_appid",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"my_secret",&local_159);
  pAVar2 = (AceopsreportRequestType *)
           aliyun::Aceops::CreateAceopsClient(local_f8,local_130,local_158);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  local_d8 = pAVar2;
  if (pAVar2 == (AceopsreportRequestType *)0x0) {
    aliyun::AceopsreportRequestType::~AceopsreportRequestType((AceopsreportRequestType *)local_c8);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Aceops::SetProxyHost((Aceops *)pAVar2,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Aceops::SetUseTls((Aceops *)local_d8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_report_response;
  local_190 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1b1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1b1);
  HttpTestListener::Start(local_190);
  std::__cxx11::string::operator=((string *)local_c8,"group");
  std::__cxx11::string::operator=((string *)(req.group.field_2._M_local_buf + 8),"name");
  std::__cxx11::string::operator=((string *)(req.name.field_2._M_local_buf + 8),"ip");
  std::__cxx11::string::operator=((string *)(req.ip.field_2._M_local_buf + 8),"type");
  std::__cxx11::string::operator=((string *)(req.type.field_2._M_local_buf + 8),"softversion");
  std::__cxx11::string::operator=((string *)(req.softversion.field_2._M_local_buf + 8),"config");
  aliyun::Aceops::report
            (local_d8,(AceopsreportResponseType *)local_c8,(AceopsErrorInfo *)((long)&aceops + 7));
  HttpTestListener::WaitComplete(local_190);
  pHVar3 = local_190;
  if (local_190 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_190);
    operator_delete(pHVar3,0x180);
  }
  pAVar2 = local_d8;
  if (local_d8 != (AceopsreportRequestType *)0x0) {
    aliyun::Aceops::~Aceops((Aceops *)local_d8);
    operator_delete(pAVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_report() {
  AceopsreportRequestType req;
  AceopsreportResponseType resp;
  Aceops* aceops = Aceops::CreateAceopsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!aceops) return 0;
  aceops->SetProxyHost("127.0.0.1:12234");
  aceops->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_report_response);
  listener->Start();
  req.group = "group";
  req.name = "name";
  req.ip = "ip";
  req.type = "type";
  req.softversion = "softversion";
  req.config = "config";
  int ret = aceops->report(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete aceops;
}